

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Object_State_Header::Object_State_Header(Object_State_Header *this,Header *H)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header6_00222530;
  KVar1 = (H->super_Header6).m_ui8ExerciseID;
  KVar2 = (H->super_Header6).m_ui8PDUType;
  KVar3 = (H->super_Header6).m_ui8ProtocolFamily;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = (H->super_Header6).m_ui8ProtocolVersion;
  (this->super_Header).super_Header6.m_ui8ExerciseID = KVar1;
  (this->super_Header).super_Header6.m_ui8PDUType = KVar2;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = KVar3;
  (this->super_Header).super_Header6.m_TimeStamp.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__TimeStamp_00221d80;
  (this->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion =
       (H->super_Header6).m_TimeStamp.m_TimeStampUnion;
  (this->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel =
       (H->super_Header6).m_TimeStamp.m_bAutoCalcRel;
  KVar1 = (H->super_Header6).m_ui8Padding1;
  KVar2 = (H->super_Header6).m_ui8Padding2;
  (this->super_Header).super_Header6.m_ui16PDULength = (H->super_Header6).m_ui16PDULength;
  (this->super_Header).super_Header6.m_ui8Padding1 = KVar1;
  (this->super_Header).super_Header6.m_ui8Padding2 = KVar2;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header7_00222580;
  (this->super_Header).super_Header6.field_0x26 = (H->super_Header6).field_0x26;
  *(undefined2 *)&(this->super_Header).super_Header6.field_0x24 =
       *(undefined2 *)&(H->super_Header6).field_0x24;
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Object_State_Header_002242b8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ObjID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RefObjID);
  this->m_ui16UpdateNum = 0;
  this->m_ui8ForceID = '\0';
  return;
}

Assistant:

Object_State_Header::Object_State_Header( const Header & H ) :
    Header( H ),
    m_ui16UpdateNum( 0 ),
    m_ui8ForceID( 0 )
{
}